

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa_milo.h
# Opt level: O0

void GrisuRound(char *buffer,int len,uint64_t delta,uint64_t rest,uint64_t ten_kappa,uint64_t wp_w)

{
  bool bVar1;
  uint64_t wp_w_local;
  uint64_t ten_kappa_local;
  uint64_t rest_local;
  uint64_t delta_local;
  int len_local;
  char *buffer_local;
  
  ten_kappa_local = rest;
  while( true ) {
    bVar1 = false;
    if (((ten_kappa_local < wp_w) && (bVar1 = false, ten_kappa <= delta - ten_kappa_local)) &&
       (bVar1 = true, wp_w <= ten_kappa_local + ten_kappa)) {
      bVar1 = (ten_kappa_local + ten_kappa) - wp_w < wp_w - ten_kappa_local;
    }
    if (!bVar1) break;
    buffer[len + -1] = buffer[len + -1] + -1;
    ten_kappa_local = ten_kappa + ten_kappa_local;
  }
  return;
}

Assistant:

inline void GrisuRound(char* buffer, int len, uint64_t delta, uint64_t rest, uint64_t ten_kappa, uint64_t wp_w) {
	while (rest < wp_w && delta - rest >= ten_kappa &&
		   (rest + ten_kappa < wp_w ||  /// closer
			wp_w - rest > rest + ten_kappa - wp_w)) {
		buffer[len - 1]--;
		rest += ten_kappa;
	}
}